

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::FamilyTest_throw_on_invalid_metric_name_Test::TestBody
          (FamilyTest_throw_on_invalid_metric_name_Test *this)

{
  bool bVar1;
  AssertHelper AStack_48;
  long *local_40;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_38._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_38._M_impl.super__Rb_tree_header._M_header;
      local_38._M_impl._0_8_ =
           (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      local_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_38._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_38._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_38._M_impl.super__Rb_tree_header._M_header._M_right =
           local_38._M_impl.super__Rb_tree_header._M_header._M_left;
      detail::
      make_unique<prometheus::Family<prometheus::Counter>,char_const(&)[1],char_const(&)[11],std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>
                ((detail *)&local_40,(char (*) [1])0x16f7e3,(char (*) [11])"empty name",
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_38);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_38);
      if (local_40 != (long *)0x0) {
        (**(code **)(*local_40 + 8))();
      }
      local_40 = (long *)0x0;
    }
  }
  testing::Message::Message((Message *)&local_38);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_48,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/family_test.cc"
             ,0x57,
             "Expected: create_family_with_invalid_name() throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_38);
  testing::internal::AssertHelper::~AssertHelper(&AStack_48);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_38._M_impl._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_38._M_impl._0_8_ + 8))();
  }
  return;
}

Assistant:

TEST(FamilyTest, throw_on_invalid_metric_name) {
  auto create_family_with_invalid_name = []() {
    return detail::make_unique<Family<Counter>>("", "empty name", Labels{});
  };
  EXPECT_ANY_THROW(create_family_with_invalid_name());
}